

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void * __thiscall
vector<vector<vector<int>_>_>::realloc
          (vector<vector<vector<int>_>_> *this,void *__ptr,size_t __size)

{
  vector<vector<int>_> *pvVar1;
  void *in_RAX;
  ulong *puVar2;
  void *extraout_RAX;
  void *extraout_RAX_00;
  uint uVar3;
  long lVar4;
  long lVar5;
  vector<vector<int>_> *pvVar6;
  
  uVar3 = 1;
  if (1 < (int)(uint)__ptr) {
    uVar3 = (uint)__ptr;
  }
  if (this->_capacity != uVar3) {
    lVar5 = (ulong)uVar3 * 0x10;
    puVar2 = (ulong *)operator_new__(lVar5 + 8);
    *puVar2 = (ulong)uVar3;
    pvVar1 = (vector<vector<int>_> *)(puVar2 + 1);
    lVar4 = 0;
    pvVar6 = pvVar1;
    do {
      vector<vector<int>_>::vector(pvVar6);
      lVar4 = lVar4 + -0x10;
      pvVar6 = pvVar6 + 1;
    } while (-lVar4 != lVar5);
    in_RAX = extraout_RAX;
    if (0 < this->_size) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        vector<vector<int>_>::operator=
                  ((vector<vector<int>_> *)((long)&pvVar1->vect + lVar4),
                   (vector<vector<int>_> *)((long)&this->vect->vect + lVar4));
        lVar5 = lVar5 + 1;
        in_RAX = (void *)(long)this->_size;
        lVar4 = lVar4 + 0x10;
      } while (lVar5 < (long)in_RAX);
    }
    this->_capacity = uVar3;
    pvVar6 = this->vect;
    if (pvVar6 != (vector<vector<int>_> *)0x0) {
      lVar4._0_4_ = pvVar6[-1]._size;
      lVar4._4_4_ = pvVar6[-1]._capacity;
      if (lVar4 != 0) {
        lVar4 = lVar4 << 4;
        do {
          vector<vector<int>_>::~vector((vector<vector<int>_> *)((long)&pvVar6[-1].vect + lVar4));
          lVar4 = lVar4 + -0x10;
        } while (lVar4 != 0);
      }
      operator_delete__(&pvVar6[-1]._size);
      in_RAX = extraout_RAX_00;
    }
    this->vect = pvVar1;
  }
  return in_RAX;
}

Assistant:

inline T max(const T& a, const T& b) {
    return (a < b) ? b : a;
}